

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CLogExp *exp)

{
  TypeInfo local_40;
  CLogExp *local_18;
  CLogExp *exp_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CLogExp *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: clogexp\n");
  TypeInfo::TypeInfo(&local_40,BOOLEAN);
  TypeInfo::operator=(&this->lastCalculatedType,&local_40);
  TypeInfo::~TypeInfo(&local_40);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CLogExp &exp ) 
{
    std::cout << "typechecker: clogexp\n";
    lastCalculatedType = enums::TPrimitiveType::BOOLEAN;
}